

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveAllCursors(BtShared *pBt,Pgno iRoot,BtCursor *pExcept)

{
  int iVar1;
  BtCursor *in_RDX;
  Pgno in_ESI;
  long in_RDI;
  BtCursor *p;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  BtCursor *pBVar2;
  
  for (pBVar2 = *(BtCursor **)(in_RDI + 0x10);
      (pBVar2 != (BtCursor *)0x0 &&
      ((pBVar2 == in_RDX || ((in_ESI != 0 && (pBVar2->pgnoRoot != in_ESI))))));
      pBVar2 = pBVar2->pNext) {
  }
  if (pBVar2 == (BtCursor *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = saveCursorsOnList(in_RDX,(Pgno)((ulong)pBVar2 >> 0x20),
                              (BtCursor *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return iVar1;
}

Assistant:

static int saveAllCursors(BtShared *pBt, Pgno iRoot, BtCursor *pExcept){
  BtCursor *p;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pExcept==0 || pExcept->pBt==pBt );
  for(p=pBt->pCursor; p; p=p->pNext){
    if( p!=pExcept && (0==iRoot || p->pgnoRoot==iRoot) ) break;
  }
  return p ? saveCursorsOnList(p, iRoot, pExcept) : SQLITE_OK;
}